

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es31cSampleShadingTests.cpp
# Opt level: O3

void __thiscall
glcts::SampleShadingRenderCase::SampleShadingRenderCase
          (SampleShadingRenderCase *this,Context *context,char *name,char *description,
          GLSLVersion glslVersion,GLenum internalFormat,TextureFormat *texFormat,char *sampler,
          char *outType,GLfloat min,GLfloat max,char *extension,GLfloat sampleShading)

{
  allocator<char> local_3f;
  allocator<char> local_3e;
  allocator<char> local_3d;
  GLfloat local_3c;
  GLfloat local_38;
  GLfloat local_34;
  
  local_3c = sampleShading;
  local_38 = min;
  local_34 = max;
  tcu::TestCase::TestCase((TestCase *)this,context->m_testCtx,name,description);
  (this->super_TestCase).m_context = context;
  (this->super_TestCase).super_TestCase.super_TestNode._vptr_TestNode =
       (_func_int **)&PTR__SampleShadingRenderCase_020fdd80;
  this->m_glslVersion = glslVersion;
  this->m_internalFormat = internalFormat;
  this->m_texFormat = *texFormat;
  std::__cxx11::string::string<std::allocator<char>>((string *)&this->m_sampler,sampler,&local_3d);
  std::__cxx11::string::string<std::allocator<char>>((string *)&this->m_outType,outType,&local_3e);
  this->m_min = local_38;
  this->m_max = local_34;
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&this->m_extension,extension,&local_3f);
  this->m_sampleShading = local_3c;
  return;
}

Assistant:

SampleShadingRenderCase::SampleShadingRenderCase(Context& context, const char* name, const char* description,
												 glu::GLSLVersion glslVersion, GLenum internalFormat,
												 tcu::TextureFormat const& texFormat, const char* sampler,
												 const char* outType, GLfloat min, GLfloat max, const char* extension,
												 GLfloat sampleShading)
	: TestCase(context, name, description)
	, m_glslVersion(glslVersion)
	, m_internalFormat(internalFormat)
	, m_texFormat(texFormat)
	, m_sampler(sampler)
	, m_outType(outType)
	, m_min(min)
	, m_max(max)
	, m_extension(extension)
	, m_sampleShading(sampleShading)
{
	DE_ASSERT(glslVersion == glu::GLSL_VERSION_310_ES || glslVersion >= glu::GLSL_VERSION_400);
}